

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_2,_0>::setTransitionMatrices
          (BeagleCPUImpl<double,_2,_0> *this,int *matrixIndices,double *inMatrices,
          double *paddedValues,int count)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  double *__dest;
  double *__src;
  int j;
  int iVar4;
  ulong uVar5;
  
  for (uVar5 = 0; uVar5 != (uint)(~(count >> 0x1f) & count); uVar5 = uVar5 + 1) {
    uVar1 = this->kStateCount;
    uVar2 = (ulong)uVar1;
    iVar4 = this->kCategoryCount;
    __src = inMatrices + (int)(uVar1 * iVar4 * (int)uVar5 * uVar1);
    __dest = this->gTransitionMatrices[matrixIndices[uVar5]];
    for (iVar3 = 0; iVar3 < iVar4; iVar3 = iVar3 + 1) {
      for (iVar4 = 0; iVar4 < (int)uVar2; iVar4 = iVar4 + 1) {
        memcpy(__dest,__src,(uVar2 & 0xffffffff) << 3);
        uVar2 = (ulong)this->kStateCount;
        __src = __src + uVar2;
        __dest[uVar2] = paddedValues[uVar5];
        __dest = __dest + this->kTransPaddedStateCount;
      }
      iVar4 = this->kCategoryCount;
    }
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setTransitionMatrices(const int* matrixIndices,
                                                             const double* inMatrices,
                                                             const double* paddedValues,
                                                             int count) {
    for (int k = 0; k < count; k++) {
        const double* inMatrix = inMatrices + k*kStateCount*kStateCount*kCategoryCount;
        int matrixIndex = matrixIndices[k];

if (T_PAD != 0) {
        const double* offsetInMatrix = inMatrix;
        REALTYPE* offsetBeagleMatrix = gTransitionMatrices[matrixIndex];
        for(int i = 0; i < kCategoryCount; i++) {
            for(int j = 0; j < kStateCount; j++) {
                beagleMemCpy(offsetBeagleMatrix, offsetInMatrix, kStateCount);
                offsetBeagleMatrix[kStateCount] = paddedValues[k];
                offsetBeagleMatrix += kTransPaddedStateCount; // Skip padding
                offsetInMatrix += kStateCount;
            }
        }
} else {
        beagleMemCpy(gTransitionMatrices[matrixIndex], inMatrix,
                     kMatrixSize * kCategoryCount);
}
    }

    return BEAGLE_SUCCESS;
}